

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

int Gia_ManToBridgeAbsNetlist(FILE *pFile,void *p,int pkg_type)

{
  int Size;
  Vec_Str_t *p_00;
  uchar *pBuffer;
  Vec_Str_t *vBuffer;
  int pkg_type_local;
  void *p_local;
  FILE *pFile_local;
  
  p_00 = Gia_ManToBridgeVec((Gia_Man_t *)p);
  Size = Vec_StrSize(p_00);
  pBuffer = (uchar *)Vec_StrArray(p_00);
  Gia_CreateHeader(pFile,pkg_type,Size,pBuffer);
  Vec_StrFree(p_00);
  return 1;
}

Assistant:

int Gia_ManToBridgeAbsNetlist( FILE * pFile, void * p, int pkg_type )
{
    Vec_Str_t * vBuffer;
    vBuffer = Gia_ManToBridgeVec( (Gia_Man_t *)p );
    Gia_CreateHeader( pFile, pkg_type, Vec_StrSize(vBuffer), (unsigned char *)Vec_StrArray(vBuffer) );
    Vec_StrFree( vBuffer );
    return 1;
}